

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exrmetrics.cpp
# Opt level: O0

int channelCount(Header *h)

{
  bool bVar1;
  const_iterator x;
  ConstIterator i;
  int channels;
  ChannelList *in_stack_ffffffffffffffd8;
  undefined4 local_c;
  
  local_c = 0;
  Imf_3_3::Header::channels((Header *)0x11896b);
  Imf_3_3::ChannelList::begin(in_stack_ffffffffffffffd8);
  while( true ) {
    Imf_3_3::Header::channels((Header *)0x118982);
    x._M_node = (_Base_ptr)Imf_3_3::ChannelList::end(in_stack_ffffffffffffffd8);
    bVar1 = Imf_3_3::operator!=((ConstIterator *)x._M_node,
                                (ConstIterator *)in_stack_ffffffffffffffd8);
    if (!bVar1) break;
    local_c = local_c + 1;
    Imf_3_3::ChannelList::ConstIterator::operator++((ConstIterator *)x._M_node);
  }
  return local_c;
}

Assistant:

int
channelCount (const Header& h)
{
    int channels = 0;
    for (ChannelList::ConstIterator i = h.channels ().begin ();
         i != h.channels ().end ();
         ++i)
    {
        ++channels;
    }
    return channels;
}